

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

string * __thiscall GrcSymbolTableEntry::FullAbbrevOmit(GrcSymbolTableEntry *this,string *staOmit)

{
  __type _Var1;
  string *in_RSI;
  string *in_RDI;
  string staTmp;
  GrcSymbolTableEntry *psymCurr;
  string *staRet;
  string *this_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar2;
  string local_98 [32];
  string local_78 [32];
  string *local_58;
  string *in_stack_ffffffffffffffb8;
  string local_40 [39];
  undefined1 local_19;
  
  local_19 = 0;
  this_00 = local_40;
  std::__cxx11::string::string(this_00,in_RSI);
  Abbreviation(in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_40);
  local_58 = (string *)**(undefined8 **)(in_RSI + 0x28);
  while( true ) {
    if (local_58 == (string *)0x0) {
      return in_RDI;
    }
    std::__cxx11::string::string(local_98,local_58);
    Abbreviation(in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_98);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00);
    if (_Var1) {
      iVar2 = 3;
    }
    else {
      std::__cxx11::string::operator+=(local_78,".");
      std::__cxx11::string::operator+=(local_78,in_RDI);
      std::__cxx11::string::operator=(in_RDI,local_78);
      local_58 = (string *)**(undefined8 **)(local_58 + 0x28);
      iVar2 = 0;
    }
    std::__cxx11::string::~string(local_78);
    if (iVar2 != 0) break;
    in_stack_ffffffffffffff64 = 0;
  }
  return in_RDI;
}

Assistant:

std::string GrcSymbolTableEntry::FullAbbrevOmit(std::string staOmit)
{
	std::string staRet = Abbreviation(m_staFieldName);
	GrcSymbolTableEntry * psymCurr = m_psymtbl->m_psymParent;
	while (psymCurr)
	{
		std::string staTmp = Abbreviation(psymCurr->m_staFieldName);
		if (staTmp == staOmit)
			break;
		staTmp += ".";
		staTmp += staRet;
		staRet = staTmp;
		psymCurr = psymCurr->m_psymtbl->m_psymParent;
	}
	return staRet;
}